

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

uint64_t sx_tm_since(uint64_t start_ticks)

{
  uint64_t uVar1;
  ulong uVar2;
  uint64_t uVar3;
  timespec ts;
  timespec local_20;
  
  if (_stm.initialized == 0xabcdabcd) {
    clock_gettime(1,&local_20);
    uVar2 = (local_20.tv_sec * 1000000000 + local_20.tv_nsec) - _stm.start;
    uVar3 = uVar2 - start_ticks;
    uVar1 = 1;
    if (start_ticks <= uVar2 && uVar3 != 0) {
      uVar1 = uVar3;
    }
    return uVar1;
  }
  __assert_fail("_stm.initialized == 0xABCDABCD",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/sokol/sokol_time.h"
                ,0xe2,"uint64_t stm_now(void)");
}

Assistant:

uint64_t sx_tm_since(uint64_t start_ticks)
{
    return stm_since(start_ticks);
}